

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

void __thiscall Js::Type::SetIsFalsy(Type *this,bool truth)

{
  code *pcVar1;
  bool bVar2;
  TypeFlagMask e1;
  TypeId typeId;
  ScriptContext *this_00;
  ThreadContext *pTVar3;
  undefined4 *puVar4;
  bool truth_local;
  Type *this_local;
  
  if (truth) {
    this_00 = GetScriptContext(this);
    pTVar3 = ScriptContext::GetThreadContext(this_00);
    typeId = GetTypeId(this);
    bVar2 = ThreadContextInfo::CanBeFalsy(&pTVar3->super_ThreadContextInfo,typeId);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/Type.cpp"
                                  ,0x9a,
                                  "(this->GetScriptContext()->GetThreadContext()->CanBeFalsy(this->GetTypeId()))"
                                  ,
                                  "this->GetScriptContext()->GetThreadContext()->CanBeFalsy(this->GetTypeId())"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    ::operator|=(&this->flags,TypeFlagMask_IsFalsy);
  }
  else {
    e1 = ::operator~(TypeFlagMask_IsFalsy);
    ::operator&=(&this->flags,e1);
  }
  return;
}

Assistant:

void Type::SetIsFalsy(const bool truth)
    {
        if (truth)
        {
            Assert(this->GetScriptContext()->GetThreadContext()->CanBeFalsy(this->GetTypeId()));
            flags |= TypeFlagMask_IsFalsy;
        }
        else
        {
            flags &= ~TypeFlagMask_IsFalsy;
        }
    }